

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode copyStandardAttributes(UA_Node *node,UA_AddNodesItem *item,UA_NodeAttributes *attr)

{
  UA_StatusCode UVar1;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  
  UVar1 = UA_copy(&item->requestedNewNodeId,node,UA_TYPES + 0x10);
  UVar2 = UA_copy(&item->browseName,&node->browseName,UA_TYPES + 0x13);
  UVar3 = UA_copy(&attr->displayName,&node->displayName,UA_TYPES + 0x14);
  UVar4 = UA_copy(&attr->description,&node->description,UA_TYPES + 0x14);
  node->writeMask = attr->writeMask;
  node->userWriteMask = attr->userWriteMask;
  return UVar4 | UVar3 | UVar2 | UVar1;
}

Assistant:

static UA_StatusCode
copyStandardAttributes(UA_Node *node, const UA_AddNodesItem *item,
                       const UA_NodeAttributes *attr) {
    UA_StatusCode retval;
    retval  = UA_NodeId_copy(&item->requestedNewNodeId.nodeId, &node->nodeId);
    retval |= UA_QualifiedName_copy(&item->browseName, &node->browseName);
    retval |= UA_LocalizedText_copy(&attr->displayName, &node->displayName);
    retval |= UA_LocalizedText_copy(&attr->description, &node->description);
    node->writeMask = attr->writeMask;
    node->userWriteMask = attr->userWriteMask;
    return retval;
}